

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSSLWraper.cpp
# Opt level: O2

size_t __thiscall
OpenSSLWrapper::SslConnection::SslWrite
          (SslConnection *this,uint8_t *szBuffer,size_t nWriteLen,int *iErrorHint)

{
  mutex *__mutex;
  uint ret_code;
  int __val;
  int *piVar1;
  runtime_error *this_00;
  SslConnection *this_01;
  size_t nWritten;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  if (this->m_ssl == (SSL *)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Not Initialized");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  __mutex = &this->m_mxSsl;
  std::mutex::lock(__mutex);
  ERR_clear_error();
  ret_code = SSL_write_ex(this->m_ssl,szBuffer,nWriteLen);
  if ((int)ret_code < 1) {
    this_01 = (SslConnection *)(ulong)ret_code;
    __val = SSL_get_error((SSL *)this->m_ssl,ret_code);
    if (iErrorHint != (int *)0x0) {
      *iErrorHint = __val;
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    switch(__val) {
    case 2:
      *(byte *)&this->m_iWantState = (byte)this->m_iWantState | 1;
      break;
    case 3:
      *(byte *)&this->m_iWantState = (byte)this->m_iWantState | 2;
      break;
    case 5:
      piVar1 = __errno_location();
      __val = *piVar1;
    default:
      GetSslErrAsString_abi_cxx11_(&local_50,this_01);
      std::operator+(&local_b0,&local_50,"errno = ");
      std::__cxx11::to_string(&local_d0,__val);
      std::operator+(&local_90,&local_b0,&local_d0);
      std::operator+(&local_70,&local_90,"\r\n");
      OutputDebugStringA(local_70._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_50);
      this->m_iShutDownFlag = 1;
      if ((this->m_fError).super__Function_base._M_manager != (_Manager_type)0x0) {
        std::function<void_()>::operator()(&this->m_fError);
      }
      break;
    case 6:
      this->m_bZeroReceived = true;
      ShutDownConnection(this,iErrorHint);
    }
  }
  else {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  return 0;
}

Assistant:

size_t SslConnection::SslWrite(const uint8_t* szBuffer, size_t nWriteLen, int* iErrorHint/* = nullptr*/)
    {
        if (nullptr == m_ssl)
            throw runtime_error("Not Initialized");

        //OSSL_HANDSHAKE_STATE hsState = SSL_get_state(m_ssl);
        //if (hsState != TLS_ST_OK)
        //    OutputDebugString(wstring(L"SSL invalid state: " + to_wstring(hsState) + L" on ssl context: " + to_wstring(reinterpret_cast<size_t>(m_ssl)) + L"\r\n").c_str());

        m_mxSsl.lock();

        ERR_clear_error();
        size_t nWritten = 0;
        int iResult = SSL_write_ex(m_ssl, szBuffer, nWriteLen, &nWritten);
        if (iResult <= 0)
        {
            iResult = SSL_get_error(m_ssl, iResult);
            if (iErrorHint != nullptr)
                *iErrorHint = iResult;
            m_mxSsl.unlock();

            switch (iResult)
            {
            case SSL_ERROR_WANT_READ:
                m_iWantState |= 1; break;
            case SSL_ERROR_WANT_WRITE:
                m_iWantState |= 2; break;
            case SSL_ERROR_ZERO_RETURN:
                m_bZeroReceived = true;
                ShutDownConnection(iErrorHint);
                break;
            case SSL_ERROR_SYSCALL:
                iResult = errno;
                [[fallthrough]];
            default:
OutputDebugStringA(string(GetSslErrAsString() + "errno = " + to_string(iResult) + "\r\n").c_str());
                m_iShutDownFlag = 1;
                if (m_fError)
                    m_fError();
            }

            return 0;
        }
        m_mxSsl.unlock();

        return nWritten;
    }